

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

bool __thiscall cmTarget::HaveInstallTreeRPATH(cmTarget *this)

{
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"INSTALL_RPATH",&local_31);
  pcVar2 = GetProperty(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
    bVar1 = false;
  }
  else {
    this_00 = this->Makefile;
    std::__cxx11::string::string((string *)&local_30,"CMAKE_SKIP_INSTALL_RPATH",&local_31);
    bVar1 = cmMakefile::IsOn(this_00,&local_30);
    bVar1 = !bVar1;
    std::__cxx11::string::~string((string *)&local_30);
  }
  return bVar1;
}

Assistant:

bool cmTarget::HaveInstallTreeRPATH() const
{
  const char* install_rpath = this->GetProperty("INSTALL_RPATH");
  return (install_rpath && *install_rpath) &&
          !this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH");
}